

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O1

void SSL_get0_peer_application_settings(SSL *ssl,uint8_t **out_data,size_t *out_len)

{
  SSL_SESSION *pSVar1;
  X509 *pXVar2;
  sess_cert_st *psVar3;
  
  pSVar1 = SSL_get_session((SSL *)ssl);
  if (pSVar1 == (SSL_SESSION *)0x0) {
    psVar3 = (sess_cert_st *)0x0;
    pXVar2 = (X509 *)0x0;
  }
  else {
    psVar3 = pSVar1->sess_cert;
    pXVar2 = pSVar1->peer;
  }
  *out_data = (uint8_t *)psVar3;
  *out_len = (size_t)pXVar2;
  return;
}

Assistant:

void SSL_get0_peer_application_settings(const SSL *ssl,
                                        const uint8_t **out_data,
                                        size_t *out_len) {
  const SSL_SESSION *session = SSL_get_session(ssl);
  Span<const uint8_t> settings =
      session ? session->peer_application_settings : Span<const uint8_t>();
  *out_data = settings.data();
  *out_len = settings.size();
}